

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_lite_unittest.pb.cc
# Opt level: O0

bool proto2_unittest::MapEnumLite_Parse(string_view name,MapEnumLite *value)

{
  bool bVar1;
  int *in_R9;
  string_view name_00;
  MapEnumLite local_24;
  bool success;
  MapEnumLite *pMStack_20;
  int int_value;
  MapEnumLite *value_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  value_local = (MapEnumLite *)name._M_len;
  name_00._M_str = (char *)&local_24;
  name_00._M_len = name_local._M_len;
  pMStack_20 = value;
  bVar1 = google::protobuf::internal::LookUpEnumValue
                    ((internal *)MapEnumLite_entries,(EnumEntry *)0x3,(size_t)value_local,name_00,
                     in_R9);
  if (bVar1) {
    *pMStack_20 = local_24;
  }
  return bVar1;
}

Assistant:

bool MapEnumLite_Parse(::absl::string_view name, MapEnumLite* PROTOBUF_NONNULL value) {
  int int_value;
  bool success = ::google::protobuf::internal::LookUpEnumValue(
      MapEnumLite_entries, 3, name, &int_value);
  if (success) {
    *value = static_cast<MapEnumLite>(int_value);
  }
  return success;
}